

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O2

void __thiscall
NshCmdArrayFindMatching_Success_Test::~NshCmdArrayFindMatching_Success_Test
          (NshCmdArrayFindMatching_Success_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshCmdArrayFindMatching, Success)
{
    nsh_cmd_array_t cmds;
    ASSERT_EQ(nsh_cmd_array_init(&cmds), NSH_STATUS_OK);

    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd1_test", &cmd_test_handler), NSH_STATUS_OK);
    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd2_test", &cmd_test_handler), NSH_STATUS_OK);
    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd3_test", &cmd_test_handler), NSH_STATUS_OK);

    static constexpr const char searched_for[] = "cmd2_";
    auto* cmd = nsh_cmd_array_find_matching(&cmds, searched_for, sizeof(searched_for) - 1);

    ASSERT_NE(cmd, nullptr);
    ASSERT_STREQ(cmd->name, "cmd2_test");
}